

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

PackageImportItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::PackageImportItemSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,Token *args_2)

{
  Token package;
  Token doubleColon;
  Token item;
  PackageImportItemSyntax *this_00;
  Token *args_local_2;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (PackageImportItemSyntax *)allocate(this,0x40,8);
  package.kind = args->kind;
  package._2_1_ = args->field_0x2;
  package.numFlags.raw = (args->numFlags).raw;
  package.rawLen = args->rawLen;
  package.info = args->info;
  doubleColon.kind = args_1->kind;
  doubleColon._2_1_ = args_1->field_0x2;
  doubleColon.numFlags.raw = (args_1->numFlags).raw;
  doubleColon.rawLen = args_1->rawLen;
  doubleColon.info = args_1->info;
  item.kind = args_2->kind;
  item._2_1_ = args_2->field_0x2;
  item.numFlags.raw = (args_2->numFlags).raw;
  item.rawLen = args_2->rawLen;
  item.info = args_2->info;
  slang::syntax::PackageImportItemSyntax::PackageImportItemSyntax(this_00,package,doubleColon,item);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }